

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_entry_from_file.c
# Opt level: O0

int setup_xattr(archive_read_disk *a,archive_entry *entry,char *name,int fd)

{
  archive_entry *entry_00;
  uint *puVar1;
  int in_ECX;
  char *in_RDX;
  archive *in_RDI;
  char *accpath;
  void *value;
  ssize_t size;
  archive_entry *in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  void *local_38;
  size_t local_30;
  int local_4;
  
  local_38 = (void *)0x0;
  entry_00 = (archive_entry *)archive_entry_sourcepath(in_stack_ffffffffffffffa8);
  if (entry_00 == (archive_entry *)0x0) {
    entry_00 = (archive_entry *)archive_entry_pathname(in_stack_ffffffffffffffa8);
  }
  if (in_ECX < 0) {
    if (*(char *)((long)&in_RDI[1].magic + 1) == '\0') {
      local_30 = lgetxattr((char *)entry_00,in_RDX,(void *)0x0,0);
    }
    else {
      local_30 = getxattr((char *)entry_00,in_RDX,(void *)0x0,0);
    }
  }
  else {
    local_30 = fgetxattr(in_ECX,in_RDX,(void *)0x0,0);
  }
  if (local_30 == 0xffffffffffffffff) {
    puVar1 = (uint *)__errno_location();
    archive_set_error(in_RDI,(int)(ulong)*puVar1,"Couldn\'t query extended attribute");
    local_4 = -0x14;
  }
  else if (((long)local_30 < 1) || (local_38 = malloc(local_30), local_38 != (void *)0x0)) {
    if (in_ECX < 0) {
      if (*(char *)((long)&in_RDI[1].magic + 1) == '\0') {
        local_30 = lgetxattr((char *)entry_00,in_RDX,local_38,local_30);
      }
      else {
        local_30 = getxattr((char *)entry_00,in_RDX,local_38,local_30);
      }
    }
    else {
      local_30 = fgetxattr(in_ECX,in_RDX,local_38,local_30);
    }
    if (local_30 == -1) {
      puVar1 = (uint *)__errno_location();
      archive_set_error(in_RDI,(int)(ulong)*puVar1,"Couldn\'t read extended attribute");
      local_4 = -0x14;
    }
    else {
      archive_entry_xattr_add_entry
                (entry_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                 (size_t)in_stack_ffffffffffffffa8);
      free(local_38);
      local_4 = 0;
    }
  }
  else {
    puVar1 = (uint *)__errno_location();
    archive_set_error(in_RDI,(int)(ulong)*puVar1,"Out of memory");
    local_4 = -0x1e;
  }
  return local_4;
}

Assistant:

static int
setup_xattr(struct archive_read_disk *a,
    struct archive_entry *entry, const char *name, int fd)
{
	ssize_t size;
	void *value = NULL;
	const char *accpath;

	accpath = archive_entry_sourcepath(entry);
	if (accpath == NULL)
		accpath = archive_entry_pathname(entry);

#if HAVE_FGETXATTR
	if (fd >= 0)
		size = fgetxattr(fd, name, NULL, 0);
	else if (!a->follow_symlinks)
		size = lgetxattr(accpath, name, NULL, 0);
	else
		size = getxattr(accpath, name, NULL, 0);
#elif HAVE_FGETEA
	if (fd >= 0)
		size = fgetea(fd, name, NULL, 0);
	else if (!a->follow_symlinks)
		size = lgetea(accpath, name, NULL, 0);
	else
		size = getea(accpath, name, NULL, 0);
#endif

	if (size == -1) {
		archive_set_error(&a->archive, errno,
		    "Couldn't query extended attribute");
		return (ARCHIVE_WARN);
	}

	if (size > 0 && (value = malloc(size)) == NULL) {
		archive_set_error(&a->archive, errno, "Out of memory");
		return (ARCHIVE_FATAL);
	}

#if HAVE_FGETXATTR
	if (fd >= 0)
		size = fgetxattr(fd, name, value, size);
	else if (!a->follow_symlinks)
		size = lgetxattr(accpath, name, value, size);
	else
		size = getxattr(accpath, name, value, size);
#elif HAVE_FGETEA
	if (fd >= 0)
		size = fgetea(fd, name, value, size);
	else if (!a->follow_symlinks)
		size = lgetea(accpath, name, value, size);
	else
		size = getea(accpath, name, value, size);
#endif

	if (size == -1) {
		archive_set_error(&a->archive, errno,
		    "Couldn't read extended attribute");
		return (ARCHIVE_WARN);
	}

	archive_entry_xattr_add_entry(entry, name, value, size);

	free(value);
	return (ARCHIVE_OK);
}